

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.l.cpp
# Opt level: O0

void __thiscall
deci_FlexLexer::deci_FlexLexer(deci_FlexLexer *this,istream *arg_yyin,ostream *arg_yyout)

{
  streambuf *local_70;
  streambuf *local_50;
  ostream *arg_yyout_local;
  istream *arg_yyin_local;
  deci_FlexLexer *this_local;
  
  FlexLexer::FlexLexer(&this->super_FlexLexer);
  (this->super_FlexLexer)._vptr_FlexLexer = (_func_int **)&PTR__deci_FlexLexer_0013ac78;
  if (arg_yyin == (istream *)0x0) {
    local_50 = (streambuf *)std::ios::rdbuf();
  }
  else {
    local_50 = (streambuf *)std::ios::rdbuf();
  }
  std::istream::istream(&this->yyin,local_50);
  if (arg_yyout == (ostream *)0x0) {
    local_70 = (streambuf *)std::ios::rdbuf();
  }
  else {
    local_70 = (streambuf *)std::ios::rdbuf();
  }
  std::ostream::ostream(&this->yyout,local_70);
  ctor_common(this);
  return;
}

Assistant:

yyFlexLexer::yyFlexLexer( std::istream* arg_yyin, std::ostream* arg_yyout ):
	yyin(arg_yyin ? arg_yyin->rdbuf() : std::cin.rdbuf()),
	yyout(arg_yyout ? arg_yyout->rdbuf() : std::cout.rdbuf())
{
	ctor_common();
}